

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  string dot_extension;
  string local_60;
  string local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,".","");
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_40.field_2._M_allocated_capacity = *psVar5;
    local_40.field_2._8_8_ = plVar4[3];
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = *psVar5;
    local_40._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_40._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  bVar3 = String::EndsWithCaseInsensitive(&this->pathname_,&local_40);
  if (bVar3) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)this);
    FilePath(__return_storage_ptr__,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar2 = (this->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->pathname_)._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(pathname_.substr(
        0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}